

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O2

void __thiscall iu_AssertionTest_x_iutest_x_NE_Test::Body(iu_AssertionTest_x_iutest_x_NE_Test *this)

{
  void **in_R9;
  int x1;
  int x0;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  int *one;
  Fixed local_190;
  
  x0 = 0;
  x1 = 1;
  iutest::internal::CmpHelperNE<int,int>
            (&iutest_ar,(internal *)"x0","x1",(char *)&x0,&x1,(int *)in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x82,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperNE<int,int>
              (&iutest_ar,(internal *)"x0","x1",(char *)&x0,&x1,(int *)in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x83,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperNE<int,int>
              (&iutest_ar,(internal *)"x0","x1",(char *)&x0,&x1,(int *)in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x84,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    one = (int *)0x1;
    iutest::internal::backward::NeHelper<true>::Compare<int>
              (&iutest_ar,"__null","one",(Object *)0x0,(int *)0x1);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x86,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
    }
    else {
      std::__cxx11::string::~string((string *)&iutest_ar);
      iutest::internal::backward::NeHelper<true>::Compare<int>
                (&iutest_ar,"nullptr","one",(Object *)0x0,one);
      if (iutest_ar.m_result == false) {
        memset(&local_190,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_190);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                   ,0x89,iutest_ar.m_message._M_dataplus._M_p);
        local_1c8._44_4_ = 2;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
      }
      else {
        std::__cxx11::string::~string((string *)&iutest_ar);
        local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = 0;
        iutest::internal::CmpHelperNE<int*,decltype(nullptr)>
                  (&iutest_ar,(internal *)"one","nullptr",(char *)&one,(int **)&local_190,in_R9);
        if (iutest_ar.m_result != false) goto LAB_00259abd;
        memset(&local_190,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_190);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                   ,0x8a,iutest_ar.m_message._M_dataplus._M_p);
        local_1c8._44_4_ = 2;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_190);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_00259abd:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(AssertionTest, NE)
{
    int x0=0, x1=1;
    IUTEST_ASSERT_NE(x0, x1);
    IUTEST_EXPECT_NE(x0, x1);
    IUTEST_INFORM_NE(x0, x1);
    int* one=reinterpret_cast<int*>(1);
    IUTEST_ASSERT_NE(NULL, one);

#if IUTEST_HAS_NULLPTR
    IUTEST_ASSERT_NE(nullptr, one);
    IUTEST_ASSERT_NE(one, nullptr);
#endif
}